

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_recursive_cte.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCTERef *op)

{
  idx_t *piVar1;
  char cVar2;
  iterator iVar3;
  PhysicalOperator *pPVar4;
  iterator iVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
  _Var6;
  InvalidInputException *pIVar7;
  allocator local_49;
  PhysicalOperatorType op_type;
  undefined7 uStack_47;
  
  if (op->materialized_cte == CTE_MATERIALIZE_ALWAYS) {
    piVar1 = &op->cte_index;
    iVar3 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->materialized_ctes)._M_h,piVar1);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      op_type = 0x1b;
      pPVar4 = Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType,unsigned_long&,unsigned_long&>
                         (this,&op->chunk_types,&op_type,
                          &(op->super_LogicalOperator).estimated_cardinality,piVar1);
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->recursive_cte_tables)._M_h,piVar1);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        optionally_owned_ptr<duckdb::ColumnDataCollection>::operator=
                  ((optionally_owned_ptr<duckdb::ColumnDataCollection> *)(pPVar4 + 1),
                   *(ColumnDataCollection **)
                    ((long)iVar5.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
                           ._M_cur + 0x10));
        _op_type = pPVar4;
        ::std::
        vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
        ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator_const>>
                  ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                    *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
                             ._M_cur + 0x10),
                   (reference_wrapper<const_duckdb::PhysicalOperator> *)&op_type);
        return pPVar4;
      }
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&op_type,"Referenced materialized CTE does not exist.",&local_49);
      InvalidInputException::InvalidInputException(pIVar7,(string *)&op_type);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  piVar1 = &op->cte_index;
  _Var6._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->recursive_cte_tables)._M_h,piVar1);
  if (_Var6._M_cur != (__node_type *)0x0) {
    if (op->is_recurring == true) {
      _Var6._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this->recurring_cte_tables)._M_h,piVar1);
      if (_Var6._M_cur == (__node_type *)0x0) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&op_type,"RECURRING can only be used with USING KEY in recursive CTE.",
                   &local_49);
        InvalidInputException::InvalidInputException(pIVar7,(string *)&op_type);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      cVar2 = (op->is_recurring & 1U) + 0x19;
    }
    else {
      cVar2 = '\x19';
    }
    op_type = cVar2;
    pPVar4 = Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType&,unsigned_long&,unsigned_long&>
                       (this,(vector<duckdb::LogicalType,_true> *)
                             (*(long *)((long)&((_Var6._M_cur)->
                                               super__Hash_node_value<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
                                               ).
                                               super__Hash_node_value_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>
                                               ._M_storage._M_storage + 8) + 0x10),&op_type,
                        &(op->super_LogicalOperator).estimated_cardinality,piVar1);
    optionally_owned_ptr<duckdb::ColumnDataCollection>::operator=
              ((optionally_owned_ptr<duckdb::ColumnDataCollection> *)(pPVar4 + 1),
               *(ColumnDataCollection **)
                ((long)&((_Var6._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>
                        ._M_storage._M_storage + 8));
    return pPVar4;
  }
  pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&op_type,"Referenced recursive CTE does not exist.",&local_49);
  InvalidInputException::InvalidInputException(pIVar7,(string *)&op_type);
  __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCTERef &op) {
	D_ASSERT(op.children.empty());

	// Check if this LogicalCTERef is supposed to scan a materialized CTE.
	if (op.materialized_cte == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
		// Lookup if there is a materialized CTE for the cte_index.
		auto materialized_cte = materialized_ctes.find(op.cte_index);

		// If this check fails, this is a reference to a materialized recursive CTE.
		if (materialized_cte != materialized_ctes.end()) {
			auto &chunk_scan = Make<PhysicalColumnDataScan>(op.chunk_types, PhysicalOperatorType::CTE_SCAN,
			                                                op.estimated_cardinality, op.cte_index);

			auto cte = recursive_cte_tables.find(op.cte_index);
			if (cte == recursive_cte_tables.end()) {
				throw InvalidInputException("Referenced materialized CTE does not exist.");
			}

			auto &cast_chunk_scan = chunk_scan.Cast<PhysicalColumnDataScan>();
			cast_chunk_scan.collection = cte->second.get();
			materialized_cte->second.push_back(cast_chunk_scan);
			return chunk_scan;
		}
	}

	// CreatePlan of a LogicalRecursiveCTE must have happened before.
	auto cte = recursive_cte_tables.find(op.cte_index);
	if (cte == recursive_cte_tables.end()) {
		throw InvalidInputException("Referenced recursive CTE does not exist.");
	}

	// If we found a recursive CTE and we want to scan the recurring table, we search for it,
	if (op.is_recurring) {
		cte = recurring_cte_tables.find(op.cte_index);
		if (cte == recurring_cte_tables.end()) {
			throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
		}
	}

	auto &types = cte->second.get()->Types();
	auto op_type =
	    op.is_recurring ? PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN : PhysicalOperatorType::RECURSIVE_CTE_SCAN;
	auto &chunk_scan = Make<PhysicalColumnDataScan>(types, op_type, op.estimated_cardinality, op.cte_index);
	auto &cast_chunk_scan = chunk_scan.Cast<PhysicalColumnDataScan>();
	cast_chunk_scan.collection = cte->second.get();
	return chunk_scan;
}